

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

string * __thiscall
spvtools::val::(anonymous_namespace)::GetIdDesc_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Instruction *inst)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream ss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,"ID <");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"> (Op");
  pcVar2 = spvOpcodeString((uint)*(ushort *)(this + 0x3a));
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GetIdDesc(const Instruction& inst) {
  std::ostringstream ss;
  ss << "ID <" << inst.id() << "> (Op" << spvOpcodeString(inst.opcode()) << ")";
  return ss.str();
}